

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O0

void Bmc_EcoMiterTest(void)

{
  int iVar1;
  int nOuts;
  FILE *pFVar2;
  Gia_Man_t *pGold_00;
  Gia_Man_t *pGVar3;
  Vec_Int_t *p;
  bool bVar4;
  int local_4c;
  int RetValue;
  int i;
  Gia_Man_t *pOld;
  Gia_Man_t *pGold;
  Gia_Obj_t *pObj;
  Gia_Man_t *pMiter;
  FILE *pFile;
  Vec_Int_t *vFans;
  char *pFileOld;
  char *pFileGold;
  
  pFVar2 = fopen("eco_gold.aig","r");
  if (pFVar2 == (FILE *)0x0) {
    printf("File \"%s\" does not exist.\n","eco_gold.aig");
  }
  else {
    fclose(pFVar2);
    pFVar2 = fopen("eco_old.aig","r");
    if (pFVar2 == (FILE *)0x0) {
      printf("File \"%s\" does not exist.\n","eco_old.aig");
    }
    else {
      fclose(pFVar2);
      pGold_00 = Gia_AigerRead("eco_gold.aig",0,0,0);
      pGVar3 = Gia_AigerRead("eco_old.aig",0,0,0);
      iVar1 = Gia_ManCiNum(pGVar3);
      p = Vec_IntAlloc(iVar1);
      local_4c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(pGVar3->vCis);
        bVar4 = false;
        if (local_4c < iVar1) {
          pGold = (Gia_Man_t *)Gia_ManCi(pGVar3,local_4c);
          bVar4 = pGold != (Gia_Man_t *)0x0;
        }
        if (!bVar4) break;
        iVar1 = Gia_ObjId(pGVar3,(Gia_Obj_t *)pGold);
        Vec_IntPush(p,iVar1);
        local_4c = local_4c + 1;
      }
      pGVar3 = Bmc_EcoMiter(pGold_00,pGVar3,p);
      Vec_IntFree(p);
      Gia_AigerWrite(pGVar3,"eco_miter.aig",0,0);
      iVar1 = Gia_ManCiNum(pGold_00);
      nOuts = Gia_ManCoNum(pGold_00);
      iVar1 = Bmc_EcoPatch(pGVar3,iVar1,nOuts);
      if (iVar1 == 1) {
        printf("Patch is computed.\n");
      }
      if (iVar1 == 0) {
        printf("Cannot be patched.\n");
      }
      if (iVar1 == -1) {
        printf("Resource limit exceeded.\n");
      }
      Gia_ManStop(pGVar3);
    }
  }
  return;
}

Assistant:

void Bmc_EcoMiterTest()
{
    char * pFileGold = "eco_gold.aig";
    char * pFileOld =  "eco_old.aig";
    Vec_Int_t * vFans;
    FILE * pFile;
    Gia_Man_t * pMiter;
    Gia_Obj_t * pObj;
    Gia_Man_t * pGold;
    Gia_Man_t * pOld;
    int i, RetValue;
    // check that the files exist
    pFile = fopen( pFileGold, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileGold );
        return;
    }
    fclose( pFile );
    pFile = fopen( pFileOld, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileOld );
        return;
    }
    fclose( pFile );
    // read files
    pGold = Gia_AigerRead( pFileGold, 0, 0, 0 );
    pOld  = Gia_AigerRead( pFileOld, 0, 0, 0 );
    // create ECO miter
    vFans = Vec_IntAlloc( Gia_ManCiNum(pOld) );
    Gia_ManForEachCi( pOld, pObj, i )
        Vec_IntPush( vFans, Gia_ObjId(pOld, pObj) );
    pMiter = Bmc_EcoMiter( pGold, pOld, vFans );
    Vec_IntFree( vFans );
    Gia_AigerWrite( pMiter, "eco_miter.aig", 0, 0 );
    // find the patch
    RetValue = Bmc_EcoPatch( pMiter, Gia_ManCiNum(pGold), Gia_ManCoNum(pGold) );
    if ( RetValue == 1 )
        printf( "Patch is computed.\n" );
    if ( RetValue == 0 )
        printf( "Cannot be patched.\n" );
    if ( RetValue == -1 )
        printf( "Resource limit exceeded.\n" );
    Gia_ManStop( pMiter );
}